

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-math.c
# Opt level: O0

void ft_trig_pseudo_rotate(PVG_FT_Vector *vec,PVG_FT_Angle theta)

{
  long lVar1;
  long lVar2;
  long lVar3;
  PVG_FT_Fixed v2;
  PVG_FT_Fixed v1;
  PVG_FT_Fixed *arctanptr;
  PVG_FT_Fixed b;
  PVG_FT_Fixed xtemp;
  PVG_FT_Fixed y;
  PVG_FT_Fixed x;
  PVG_FT_Angle PStack_18;
  PVG_FT_Int i;
  PVG_FT_Angle theta_local;
  PVG_FT_Vector *vec_local;
  
  y = vec->x;
  xtemp = vec->y;
  for (PStack_18 = theta; PStack_18 < -0x2d0000; PStack_18 = PStack_18 + 0x5a0000) {
    lVar3 = -y;
    y = xtemp;
    xtemp = lVar3;
  }
  for (; 0x2d0000 < PStack_18; PStack_18 = PStack_18 + -0x5a0000) {
    lVar3 = -xtemp;
    xtemp = y;
    y = lVar3;
  }
  v1 = (PVG_FT_Fixed)ft_trig_arctan_table;
  arctanptr = (PVG_FT_Fixed *)0x1;
  for (x._4_4_ = 1; x._4_4_ < 0x17; x._4_4_ = x._4_4_ + 1) {
    lVar2 = xtemp + (long)arctanptr >> ((byte)x._4_4_ & 0x3f);
    lVar3 = y + (long)arctanptr >> ((byte)x._4_4_ & 0x3f);
    if (PStack_18 < 0) {
      lVar3 = -lVar3;
      lVar1 = *(long *)v1;
    }
    else {
      lVar2 = -lVar2;
      lVar1 = -*(long *)v1;
    }
    PStack_18 = lVar1 + PStack_18;
    y = y + lVar2;
    xtemp = xtemp + lVar3;
    v1 = v1 + 8;
    arctanptr = (PVG_FT_Fixed *)((long)arctanptr << 1);
  }
  vec->x = y;
  vec->y = xtemp;
  return;
}

Assistant:

static void ft_trig_pseudo_rotate(PVG_FT_Vector* vec, PVG_FT_Angle theta)
{
    PVG_FT_Int          i;
    PVG_FT_Fixed        x, y, xtemp, b;
    const PVG_FT_Fixed* arctanptr;

    x = vec->x;
    y = vec->y;

    /* Rotate inside [-PI/4,PI/4] sector */
    while (theta < -PVG_FT_ANGLE_PI4) {
        xtemp = y;
        y = -x;
        x = xtemp;
        theta += PVG_FT_ANGLE_PI2;
    }

    while (theta > PVG_FT_ANGLE_PI4) {
        xtemp = -y;
        y = x;
        x = xtemp;
        theta -= PVG_FT_ANGLE_PI2;
    }

    arctanptr = ft_trig_arctan_table;

    /* Pseudorotations, with right shifts */
    for (i = 1, b = 1; i < PVG_FT_TRIG_MAX_ITERS; b <<= 1, i++) {
        PVG_FT_Fixed v1 = ((y + b) >> i);
        PVG_FT_Fixed v2 = ((x + b) >> i);
        if (theta < 0) {
            xtemp = x + v1;
            y = y - v2;
            x = xtemp;
            theta += *arctanptr++;
        } else {
            xtemp = x - v1;
            y = y + v2;
            x = xtemp;
            theta -= *arctanptr++;
        }
    }

    vec->x = x;
    vec->y = y;
}